

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O0

void __thiscall
TPZSkylMatrix<std::complex<long_double>_>::UpdateFrom
          (TPZSkylMatrix<std::complex<long_double>_> *this,
          TPZAutoPointer<TPZMatrix<std::complex<long_double>_>_> *mat)

{
  TPZMatrix<std::complex<long_double>_> *pTVar1;
  int64_t iVar2;
  int64_t iVar3;
  complex<long_double> *__dest;
  complex<long_double> *__src;
  TPZAutoPointer<TPZMatrix<std::complex<long_double>_>_> *in_RSI;
  long in_RDI;
  TPZSkylMatrix<std::complex<long_double>_> *skylmat;
  TPZMatrix<std::complex<long_double>_> *matrix;
  size_t in_stack_000003c8;
  char *in_stack_000003d0;
  long local_40;
  
  pTVar1 = TPZAutoPointer<TPZMatrix<std::complex<long_double>_>_>::operator->(in_RSI);
  if (pTVar1 == (TPZMatrix<std::complex<long_double>_> *)0x0) {
    local_40 = 0;
  }
  else {
    local_40 = __dynamic_cast(pTVar1,&TPZMatrix<std::complex<long_double>>::typeinfo,
                              &TPZSkylMatrix<std::complex<long_double>>::typeinfo,0);
  }
  if (local_40 == 0) {
    pzinternal::DebugStopImpl(in_stack_000003d0,in_stack_000003c8);
  }
  iVar2 = TPZVec<std::complex<long_double>_>::NElements
                    ((TPZVec<std::complex<long_double>_> *)(in_RDI + 0x40));
  iVar3 = TPZVec<std::complex<long_double>_>::NElements
                    ((TPZVec<std::complex<long_double>_> *)(local_40 + 0x40));
  if (iVar2 != iVar3) {
    pzinternal::DebugStopImpl(in_stack_000003d0,in_stack_000003c8);
  }
  __dest = TPZVec<std::complex<long_double>_>::operator[]
                     ((TPZVec<std::complex<long_double>_> *)(in_RDI + 0x40),0);
  __src = TPZVec<std::complex<long_double>_>::operator[]
                    ((TPZVec<std::complex<long_double>_> *)(local_40 + 0x40),0);
  iVar2 = TPZVec<std::complex<long_double>_>::NElements
                    ((TPZVec<std::complex<long_double>_> *)(in_RDI + 0x40));
  memcpy(__dest,__src,iVar2 << 5);
  *(undefined1 *)(in_RDI + 0x18) = *(undefined1 *)(local_40 + 0x18);
  *(undefined1 *)(in_RDI + 0x19) = *(undefined1 *)(local_40 + 0x19);
  return;
}

Assistant:

void TPZSkylMatrix<TVar>::UpdateFrom(TPZAutoPointer<TPZMatrix<TVar> > mat)
{
    TPZMatrix<TVar> *matrix = mat.operator->();
    TPZSkylMatrix<TVar> *skylmat = dynamic_cast<TPZSkylMatrix<TVar> *>(matrix);
    if (!skylmat) {
        DebugStop();
    }
    if (fStorage.NElements() != skylmat->fStorage.NElements()) {
        DebugStop();
    }
    memcpy(&fStorage[0], &(skylmat->fStorage[0]) , fStorage.NElements()*sizeof(TVar));
    this->fDecomposed = skylmat->fDecomposed;
    this->fDefPositive = skylmat->fDefPositive;
}